

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# accessors.h
# Opt level: O2

upb_Array * upb_Message_GetArray(upb_Message *msg,upb_MiniTableField *f)

{
  byte bVar1;
  _Bool _Var2;
  undefined8 *from;
  upb_Array *default_val;
  upb_Array *ret;
  undefined8 local_20;
  upb_Array *local_18;
  
  bVar1 = f->mode_dont_copy_me__upb_internal_use_only;
  if (bVar1 < 0xc0) {
    __assert_fail("_upb_MiniTableField_GetRep_dont_copy_me__upb_internal_use_only(f) == kUpb_FieldRep_NativePointer"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/mini_table/internal/field.h"
                  ,0xc4,
                  "void _upb_MiniTableField_CheckIsArray_dont_copy_me__upb_internal_use_only(const struct upb_MiniTableField *)"
                 );
  }
  if ((bVar1 & 3) != 1) {
    __assert_fail("upb_MiniTableField_IsArray(f)",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/mini_table/internal/field.h"
                  ,0xc5,
                  "void _upb_MiniTableField_CheckIsArray_dont_copy_me__upb_internal_use_only(const struct upb_MiniTableField *)"
                 );
  }
  if (f->presence != 0) {
    __assert_fail("f->presence == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/mini_table/internal/field.h"
                  ,0xc6,
                  "void _upb_MiniTableField_CheckIsArray_dont_copy_me__upb_internal_use_only(const struct upb_MiniTableField *)"
                 );
  }
  local_20 = 0;
  if ((bVar1 & 8) != 0) {
    __assert_fail("!upb_MiniTableField_IsExtension(field)",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/internal/accessors.h"
                  ,0x10d,
                  "void _upb_Message_GetNonExtensionField(const struct upb_Message *, const upb_MiniTableField *, const void *, void *)"
                 );
  }
  _Var2 = _upb_MiniTableField_DataIsZero_dont_copy_me__upb_internal_use_only(f,&local_20);
  if (!_Var2) {
    _Var2 = upb_Message_HasBaseField(msg,f);
    if (!_Var2) {
      from = &local_20;
      goto LAB_0024a02c;
    }
  }
  from = (undefined8 *)((long)&msg->field_0 + (ulong)f->offset_dont_copy_me__upb_internal_use_only);
LAB_0024a02c:
  _upb_MiniTableField_DataCopy_dont_copy_me__upb_internal_use_only(f,&local_18,from);
  return local_18;
}

Assistant:

UPB_API_INLINE const upb_Array* upb_Message_GetArray(
    const struct upb_Message* msg, const upb_MiniTableField* f) {
  UPB_PRIVATE(_upb_MiniTableField_CheckIsArray)(f);
  upb_Array* ret;
  const upb_Array* default_val = NULL;
  _upb_Message_GetNonExtensionField(msg, f, &default_val, &ret);
  return ret;
}